

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

void __thiscall BMP::buildingCodeShannonFano(BMP *this,char lit,string *code,int left,int right)

{
  pointer pcVar1;
  long lVar2;
  longdouble *plVar3;
  long lVar4;
  int iVar5;
  int right_00;
  longdouble lVar6;
  longdouble lVar7;
  string local_70;
  string local_50;
  
  if ((byte)(lit - 0x32U) < 0xfe) {
    std::__cxx11::string::_M_replace((ulong)code,0,(char *)code->_M_string_length,0x1082dc);
  }
  else {
    std::__cxx11::string::push_back((char)code);
  }
  if (left == right) {
    std::__cxx11::string::_M_assign((string *)&this->alphabet->symbol[left].codeShannonFano);
    return;
  }
  right_00 = left;
  if (left < right) {
    lVar2 = (long)left;
    lVar4 = right - lVar2;
    plVar3 = &this->alphabet->symbol[lVar2].frq;
    lVar6 = (longdouble)0;
    do {
      lVar6 = *plVar3 + lVar6;
      plVar3 = plVar3 + 8;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    if (left < right) {
      plVar3 = &this->alphabet->symbol[lVar2].frq;
      lVar7 = (longdouble)0;
      iVar5 = left;
      do {
        right_00 = iVar5;
        lVar7 = *plVar3 + lVar7;
        if (lVar6 * (longdouble)0.5 <= lVar7) break;
        iVar5 = right_00 + 1;
        plVar3 = plVar3 + 8;
        right_00 = right;
      } while (right != iVar5);
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (code->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + code->_M_string_length);
  buildingCodeShannonFano(this,'1',&local_70,left,right_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pcVar1 = (code->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + code->_M_string_length);
  buildingCodeShannonFano(this,'0',&local_50,right_00 + 1,right);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BMP::buildingCodeShannonFano(char lit, std::string code, int left, int right)
{
    if ( lit != '1' && lit != '0' ) {
        code = "";
    } else {
        code += lit;
    }

    if ( left == right ) {
        alphabet->symbol[ left ].codeShannonFano = code;
    } else {
        long double midFrq = 0;
        int medium         = left;
        long double temp   = 0;

        for ( auto i = left; i < right; i++ ){
            midFrq += alphabet->symbol[ i ].frq;
        }

        midFrq /= 2;

        while ( medium < right && temp + alphabet->symbol[ medium ].frq < midFrq){
            temp += alphabet->symbol[ medium ].frq;
            medium++;
        }

        buildingCodeShannonFano( '1', code, left, medium );
        buildingCodeShannonFano( '0', code, medium + 1, right );
    }
}